

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::fatal<char_const(&)[98],ktx::SelectorRange&,unsigned_int_const&,unsigned_int_const&>
          (Reporter *this,ReturnCode return_code,char (*args) [98],SelectorRange *args_1,
          uint *args_2,uint *args_3)

{
  format_string<ktx::SelectorRange_&,_const_unsigned_int_&,_const_unsigned_int_&> fmt;
  size_t sVar1;
  undefined8 uVar2;
  char *in_RCX;
  size_t in_RDX;
  undefined8 in_RDI;
  ostream *in_R8;
  SelectorRange *in_R9;
  ReturnCode returnCode;
  FatalError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  ostream *in_stack_ffffffffffffff20;
  basic_string_view<char> in_stack_ffffffffffffff28;
  char *args_2_00;
  uint *in_stack_ffffffffffffff50;
  
  returnCode = (ReturnCode)((ulong)in_RDI >> 0x20);
  this_00 = (FatalError *)&stack0xffffffffffffff48;
  args_2_00 = "{} fatal: ";
  sVar1 = std::char_traits<char>::length((char_type *)0x27837d);
  *(size_t *)&this_00->returnCode = sVar1;
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff20,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff18);
  std::char_traits<char>::length((char_type *)0x27841a);
  fmt.str_.size_ = in_RDX;
  fmt.str_.data_ = in_RCX;
  ::fmt::v10::print<ktx::SelectorRange&,unsigned_int_const&,unsigned_int_const&>
            (in_R8,fmt,in_R9,in_stack_ffffffffffffff50,(uint *)args_2_00);
  sVar1 = std::char_traits<char>::length((char_type *)0x2784bd);
  ::fmt::v10::print<>(in_stack_ffffffffffffff20,(format_string<>)in_stack_ffffffffffffff28);
  uVar2 = __cxa_allocate_exception(0x10);
  FatalError::FatalError(this_00,returnCode);
  __cxa_throw(uVar2,&FatalError::typeinfo,FatalError::~FatalError);
}

Assistant:

void fatal(ReturnCode return_code, Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
        throw FatalError(return_code);
    }